

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

void Saig_ManBmcSupergateTest(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *p_00;
  uint local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSuper;
  Aig_Man_t *p_local;
  
  Abc_Print(1,"Supergates: ");
  for (local_24 = 0; iVar1 = Saig_ManPoNum(p), (int)local_24 < iVar1; local_24 = local_24 + 1) {
    Vec_PtrEntry(p->vCos,local_24);
    p_00 = Saig_ManBmcSupergate(p,local_24);
    uVar2 = Vec_PtrSize(p_00);
    uVar3 = Saig_ManBmcCountRefed(p,p_00);
    Abc_Print(1,"%d=%d(%d) ",(ulong)local_24,(ulong)uVar2,(ulong)uVar3);
    Vec_PtrFree(p_00);
  }
  Abc_Print(1,"\n");
  return;
}

Assistant:

void Saig_ManBmcSupergateTest( Aig_Man_t * p )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "Supergates: " );
    Saig_ManForEachPo( p, pObj, i )
    {
        vSuper = Saig_ManBmcSupergate( p, i );
        Abc_Print( 1, "%d=%d(%d) ", i, Vec_PtrSize(vSuper), Saig_ManBmcCountRefed(p, vSuper) );
        Vec_PtrFree( vSuper );
    }
    Abc_Print( 1, "\n" );
}